

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollup.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  flvtag_avcpackettype_t fVar2;
  FILE *flv_00;
  FILE *flv_01;
  utf8_char_t *puVar3;
  double dVar4;
  double dVar5;
  FILE *out;
  FILE *flv;
  int has_video;
  int has_audio;
  srt_t *srt;
  flvtag_t tag;
  int i;
  char **argv_local;
  int argc_local;
  
  tag.aloc._4_4_ = 0;
  _has_video = (srt_t *)0x0;
  flv_00 = flv_open_read(argv[1]);
  flv_01 = flv_open_write(argv[2]);
  flvtag_init((flvtag_t *)&srt);
  _has_video = srt_new();
  tag.aloc._4_4_ = 0;
  while (*wonderland[tag.aloc._4_4_] != '\0') {
    append_caption(wonderland[tag.aloc._4_4_],_has_video);
    tag.aloc._4_4_ = tag.aloc._4_4_ + 1;
  }
  iVar1 = flv_read_header(flv_00,(int *)((long)&flv + 4),(int *)&flv);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s is not an flv file\n",argv[1]);
    argv_local._4_4_ = 1;
  }
  else {
    flv_write_header(flv_01,flv._4_4_,(int)flv);
    while( true ) {
      iVar1 = flv_read_tag(flv_00,(flvtag_t *)&srt);
      if (iVar1 == 0) break;
      if (_has_video->cue_head != (vtt_block_t *)0x0) {
        fVar2 = flvtag_avcpackettype((flvtag_t *)&srt);
        if (fVar2 == flvtag_avcpackettype_nalu) {
          dVar5 = _has_video->cue_head->timestamp;
          dVar4 = flvtag_pts_seconds((flvtag_t *)&srt);
          __stream = _stderr;
          if (dVar5 <= dVar4) {
            dVar5 = flvtag_pts_seconds((flvtag_t *)&srt);
            puVar3 = srt_cue_data(_has_video->cue_head);
            fprintf(__stream,"%f %s\n",dVar5,puVar3);
            puVar3 = srt_cue_data(_has_video->cue_head);
            flvtag_addcaption_text((flvtag_t *)&srt,puVar3);
            srt_cue_free_head(_has_video);
          }
        }
      }
      flv_write_tag(flv_01,(flvtag_t *)&srt);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int i = 0;
    flvtag_t tag;
    srt_t* srt = 0;
    int has_audio, has_video;
    FILE* flv = flv_open_read(argv[1]);
    FILE* out = flv_open_write(argv[2]);
    flvtag_init(&tag);

    srt = srt_new();

    for (i = 0; wonderland[i][0]; ++i) {
        append_caption(wonderland[i], srt);
    }

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    while (flv_read_tag(flv, &tag)) {
        if (srt->cue_head && flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag) && srt->cue_head->timestamp <= flvtag_pts_seconds(&tag)) {
            fprintf(stderr, "%f %s\n", flvtag_pts_seconds(&tag), srt_cue_data(srt->cue_head));
            flvtag_addcaption_text(&tag, srt_cue_data(srt->cue_head));
            srt_cue_free_head(srt);
        }

        flv_write_tag(out, &tag);
    }

    return EXIT_SUCCESS;
}